

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::FormatSinkImpl::PutPaddedString
          (FormatSinkImpl *this,string_view value,int width,int precision,bool left)

{
  string_view v;
  unsigned_long *puVar1;
  const_pointer __str;
  size_type used;
  undefined1 local_58 [8];
  string_view shown;
  size_type local_40;
  size_t n;
  size_t space_remaining;
  int local_28;
  int iStack_24;
  bool left_local;
  int precision_local;
  int width_local;
  FormatSinkImpl *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (FormatSinkImpl *)value._M_len;
  n = 0;
  if (-1 < width) {
    n = (size_t)width;
  }
  space_remaining._7_1_ = left;
  local_28 = precision;
  iStack_24 = width;
  _precision_local = this;
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (-1 < local_28) {
    shown._M_str = (char *)(long)local_28;
    puVar1 = std::min<unsigned_long>(&local_40,(unsigned_long *)&shown._M_str);
    local_40 = *puVar1;
  }
  __str = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_58,__str,local_40);
  used = std::basic_string_view<char,_std::char_traits<char>_>::size
                   ((basic_string_view<char,_std::char_traits<char>_> *)local_58);
  n = Excess(used,n);
  if ((space_remaining._7_1_ & 1) == 0) {
    Append(this,n,' ');
  }
  v._M_str = (char *)shown._M_len;
  v._M_len = (size_t)local_58;
  Append(this,v);
  if ((space_remaining._7_1_ & 1) != 0) {
    Append(this,n,' ');
  }
  return true;
}

Assistant:

bool FormatSinkImpl::PutPaddedString(string_view value, int width,
                                     int precision, bool left) {
  size_t space_remaining = 0;
  if (width >= 0)
    space_remaining = static_cast<size_t>(width);
  size_t n = value.size();
  if (precision >= 0) n = std::min(n, static_cast<size_t>(precision));
  string_view shown(value.data(), n);
  space_remaining = Excess(shown.size(), space_remaining);
  if (!left) Append(space_remaining, ' ');
  Append(shown);
  if (left) Append(space_remaining, ' ');
  return true;
}